

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

Totals * __thiscall Catch::Totals::operator+=(Totals *this,Totals *other)

{
  uint64_t *puVar1;
  
  (this->assertions).passed = (this->assertions).passed + (other->assertions).passed;
  puVar1 = &(this->assertions).failed;
  *puVar1 = *puVar1 + (other->assertions).failed;
  puVar1 = &(this->assertions).failedButOk;
  *puVar1 = *puVar1 + (other->assertions).failedButOk;
  puVar1 = &(this->assertions).skipped;
  *puVar1 = *puVar1 + (other->assertions).skipped;
  (this->testCases).passed = (this->testCases).passed + (other->testCases).passed;
  puVar1 = &(this->testCases).failed;
  *puVar1 = *puVar1 + (other->testCases).failed;
  puVar1 = &(this->testCases).failedButOk;
  *puVar1 = *puVar1 + (other->testCases).failedButOk;
  puVar1 = &(this->testCases).skipped;
  *puVar1 = *puVar1 + (other->testCases).skipped;
  return this;
}

Assistant:

Totals& Totals::operator += ( Totals const& other ) {
        assertions += other.assertions;
        testCases += other.testCases;
        return *this;
    }